

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_channel_check_throttle(ssh2_channel *c)

{
  _Bool _Var1;
  
  if (((c->throttled_by_backlog == false) && (c->connlayer->all_channels_throttled == false)) &&
     (c->pending_eof == false)) {
    _Var1 = (c->closes & 1) == 0;
  }
  else {
    _Var1 = false;
  }
  (*c->chan->vt->set_input_wanted)(c->chan,_Var1);
  return;
}

Assistant:

static void ssh2_channel_check_throttle(struct ssh2_channel *c)
{
    /*
     * We don't want this channel to read further input if this
     * particular channel has a backed-up SSH window, or if the
     * outgoing side of the whole SSH connection is currently
     * throttled, or if this channel already has an outgoing EOF
     * either sent or pending.
     */
    chan_set_input_wanted(c->chan,
                          !c->throttled_by_backlog &&
                          !c->connlayer->all_channels_throttled &&
                          !c->pending_eof &&
                          !(c->closes & CLOSES_SENT_EOF));
}